

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPFakeTransmitter::RTPFakeTransmitter(RTPFakeTransmitter *this,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  RTPFakeTransmitter *this_local;
  
  RTPTransmitter::RTPTransmitter(&this->super_RTPTransmitter,mgr);
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPFakeTransmitter_001ae9c8;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&this->localIPs);
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
  ::RTPHashTable(&this->destinations,mgr,0xd);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::list
            (&this->rawpacketlist);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPFakeTransmitter::PortInfo_*,_jrtplib::RTPFakeTrans_GetHashIndex_uint32_t,_8317>
  ::RTPKeyHashTable(&this->acceptignoreinfo,mgr,0xb);
  this->created = false;
  this->init = false;
  return;
}

Assistant:

RTPFakeTransmitter::RTPFakeTransmitter(RTPMemoryManager *mgr ) : RTPTransmitter(mgr), destinations(mgr,RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),acceptignoreinfo(mgr,RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}